

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

bool __thiscall
soplex::SPxBasisBase<double>::readBasis
          (SPxBasisBase<double> *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  Desc *pDVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  SPxStatus SVar5;
  int iVar6;
  Status SVar7;
  int iVar8;
  int iVar9;
  Section SVar10;
  ostream *poVar11;
  Status *pSVar12;
  double *pdVar13;
  char *pcVar14;
  long in_RCX;
  Desc *in_RDX;
  istream *in_RSI;
  SPxBasisBase<double> *in_RDI;
  int r;
  int c;
  MPSInput mps;
  int i_2;
  int i_1;
  Desc l_desc;
  DataKey key_1;
  int i;
  stringstream name_1;
  int nRows;
  DataKey key;
  int j;
  stringstream name;
  int nCols;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  NameSet *cNames;
  NameSet *rNames;
  undefined4 in_stack_fffffffffffff788;
  int in_stack_fffffffffffff78c;
  undefined7 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff797;
  Type in_stack_fffffffffffff798;
  Type in_stack_fffffffffffff79c;
  Status in_stack_fffffffffffff7a0;
  Type in_stack_fffffffffffff7a4;
  Type in_stack_fffffffffffff7a8;
  Status in_stack_fffffffffffff7ac;
  Desc *in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  Real in_stack_fffffffffffff7c0;
  int in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  NameSet *in_stack_fffffffffffff7d0;
  double dVar15;
  char *in_stack_fffffffffffff7e0;
  DataKey *in_stack_fffffffffffff7e8;
  NameSet *in_stack_fffffffffffff7f0;
  int iVar16;
  int local_788;
  MPSInput local_780;
  int local_420;
  int local_41c;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> local_418;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> local_400;
  string local_3d8 [32];
  DataKey local_3b8;
  DataKey local_3b0;
  int local_3a4;
  stringstream local_3a0 [16];
  ostream local_390 [380];
  int local_214;
  string local_210 [32];
  DataKey local_1f0;
  DataKey local_1e8;
  int local_1e0;
  stringstream local_1d0 [16];
  ostream local_1c0 [380];
  int local_44;
  Desc *local_40;
  long local_38;
  long local_30;
  Desc *local_28;
  long local_20;
  Desc *local_18;
  istream *local_10;
  
  local_38 = 0;
  local_40 = (Desc *)0x0;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RCX == 0) {
    local_44 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x225b3f);
    std::__cxx11::stringstream::stringstream(local_1d0);
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc);
    lVar2 = local_38;
    NameSet::NameSet(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8,
                     in_stack_fffffffffffff7c0,
                     (Real)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
    local_38 = lVar2;
    NameSet::reMax((NameSet *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                   in_stack_fffffffffffff78c);
    for (local_1e0 = 0; local_1e0 < local_44; local_1e0 = local_1e0 + 1) {
      poVar11 = std::operator<<(local_1c0,"x");
      std::ostream::operator<<(poVar11,local_1e0);
      local_1f0 = (DataKey)SPxSolverBase<double>::colId
                                     ((SPxSolverBase<double> *)
                                      CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                                      0);
      local_1e8 = local_1f0;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      std::__cxx11::string::~string(local_210);
    }
    local_30 = local_38;
    std::__cxx11::stringstream::~stringstream(local_1d0);
  }
  if (local_28 == (Desc *)0x0) {
    local_214 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x225d49);
    std::__cxx11::stringstream::stringstream(local_3a0);
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc);
    pDVar1 = local_40;
    NameSet::NameSet(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8,
                     in_stack_fffffffffffff7c0,
                     (Real)CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8));
    local_40 = pDVar1;
    NameSet::reMax((NameSet *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                   in_stack_fffffffffffff78c);
    for (local_3a4 = 0; local_3a4 < local_214; local_3a4 = local_3a4 + 1) {
      poVar11 = std::operator<<(local_390,"C");
      std::ostream::operator<<(poVar11,local_3a4);
      local_3b8 = (DataKey)SPxSolverBase<double>::rowId
                                     ((SPxSolverBase<double> *)
                                      CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                                      0);
      local_3b0 = local_3b8;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      NameSet::add(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      std::__cxx11::string::~string(local_3d8);
    }
    local_28 = local_40;
    std::__cxx11::stringstream::~stringstream(local_3a0);
  }
  SVar5 = status(in_RDI);
  if (SVar5 == NO_PROBLEM) {
    (*in_RDI->_vptr_SPxBasisBase[7])(in_RDI,in_RDI->theLP,0);
  }
  Desc::Desc(in_stack_fffffffffffff7b0,
             (Desc *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_41c = 0;
  while (iVar16 = local_41c, iVar6 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x225f9f),
        iVar16 < iVar6) {
    SVar7 = dualRowStatus((SPxBasisBase<double> *)
                          CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                          (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
    pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                        (&local_418,local_41c);
    *pSVar12 = SVar7;
    local_41c = local_41c + 1;
  }
  for (local_420 = 0; iVar9 = local_420,
      iVar8 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x22604d), iVar9 < iVar8;
      local_420 = local_420 + 1) {
    pdVar13 = SPxLPBase<double>::lower
                        ((SPxLPBase<double> *)
                         CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                         in_stack_fffffffffffff78c);
    dVar15 = *pdVar13;
    pdVar13 = SPxLPBase<double>::upper
                        ((SPxLPBase<double> *)
                         CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                         in_stack_fffffffffffff78c);
    if ((dVar15 != *pdVar13) || (NAN(dVar15) || NAN(*pdVar13))) {
      pdVar13 = SPxLPBase<double>::lower
                          ((SPxLPBase<double> *)
                           CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                           in_stack_fffffffffffff78c);
      dVar15 = *pdVar13;
      pdVar13 = (double *)infinity();
      if (dVar15 <= -*pdVar13) {
        pdVar13 = SPxLPBase<double>::upper
                            ((SPxLPBase<double> *)
                             CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                             in_stack_fffffffffffff78c);
        dVar15 = *pdVar13;
        pdVar13 = (double *)infinity();
        if (*pdVar13 <= dVar15) {
          pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                              (&local_400,local_420);
          *pSVar12 = P_FREE;
          goto LAB_00226253;
        }
      }
      pdVar13 = SPxLPBase<double>::lower
                          ((SPxLPBase<double> *)
                           CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
                           in_stack_fffffffffffff78c);
      dVar15 = *pdVar13;
      pdVar13 = (double *)infinity();
      if (-*pdVar13 < dVar15) {
        pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                            (&local_400,local_420);
        *pSVar12 = P_ON_LOWER;
      }
      else {
        pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                            (&local_400,local_420);
        *pSVar12 = P_ON_UPPER;
      }
    }
    else {
      pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                          (&local_400,local_420);
      *pSVar12 = P_FIXED;
    }
LAB_00226253:
  }
  MPSInput::MPSInput(&local_780,local_10);
  bVar3 = MPSInput::readLine((MPSInput *)CONCAT44(iVar6,iVar16));
  if ((bVar3) && (pcVar14 = MPSInput::field0(&local_780), pcVar14 != (char *)0x0)) {
    pcVar14 = MPSInput::field0(&local_780);
    iVar9 = strcmp(pcVar14,"NAME");
    if (iVar9 == 0) {
      while (bVar3 = MPSInput::readLine((MPSInput *)CONCAT44(iVar6,iVar16)), bVar3) {
        local_788 = -1;
        pcVar14 = MPSInput::field0(&local_780);
        if (pcVar14 != (char *)0x0) {
          pcVar14 = MPSInput::field0(&local_780);
          iVar9 = strcmp(pcVar14,"ENDATA");
          if (iVar9 == 0) {
            MPSInput::setSection(&local_780,ENDATA);
            break;
          }
        }
        pcVar14 = MPSInput::field1(&local_780);
        if ((pcVar14 == (char *)0x0) ||
           (pcVar14 = MPSInput::field2(&local_780), pcVar14 == (char *)0x0)) break;
        MPSInput::field2(&local_780);
        iVar9 = NameSet::number((NameSet *)
                                CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                                (char *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790
                                                ));
        if (iVar9 < 0) break;
        pcVar14 = MPSInput::field1(&local_780);
        if (*pcVar14 == 'X') {
          pcVar14 = MPSInput::field3(&local_780);
          if (pcVar14 == (char *)0x0) break;
          in_stack_fffffffffffff7b0 = local_28;
          MPSInput::field3(&local_780);
          in_stack_fffffffffffff7bc =
               NameSet::number((NameSet *)
                               CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                               (char *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790)
                              );
          local_788 = in_stack_fffffffffffff7bc;
          if (in_stack_fffffffffffff7bc < 0) break;
        }
        pcVar14 = MPSInput::field1(&local_780);
        iVar8 = strcmp(pcVar14,"XU");
        if (iVar8 == 0) {
          in_stack_fffffffffffff7ac =
               dualColStatus((SPxBasisBase<double> *)
                             CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                             (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
          pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                              (&local_400,iVar9);
          *pSVar12 = in_stack_fffffffffffff7ac;
          in_stack_fffffffffffff7a8 =
               LPRowSetBase<double>::type
                         ((LPRowSetBase<double> *)
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                          in_stack_fffffffffffff7a4);
          if (in_stack_fffffffffffff7a8 == GREATER_EQUAL) {
            pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                (&local_418,local_788);
            *pSVar12 = P_ON_LOWER;
          }
          else {
            in_stack_fffffffffffff7a4 =
                 LPRowSetBase<double>::type
                           ((LPRowSetBase<double> *)
                            CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                            in_stack_fffffffffffff7a4);
            if (in_stack_fffffffffffff7a4 == EQUAL) {
              pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                  (&local_418,local_788);
              *pSVar12 = P_FIXED;
            }
            else {
              pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                  (&local_418,local_788);
              *pSVar12 = P_ON_UPPER;
            }
          }
        }
        else {
          pcVar14 = MPSInput::field1(&local_780);
          iVar8 = strcmp(pcVar14,"XL");
          if (iVar8 == 0) {
            in_stack_fffffffffffff7a0 =
                 dualColStatus((SPxBasisBase<double> *)
                               CONCAT44(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8),
                               (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
            pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                (&local_400,iVar9);
            *pSVar12 = in_stack_fffffffffffff7a0;
            in_stack_fffffffffffff79c =
                 LPRowSetBase<double>::type
                           ((LPRowSetBase<double> *)
                            CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                            in_stack_fffffffffffff7a4);
            if (in_stack_fffffffffffff79c == LESS_EQUAL) {
              pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                  (&local_418,local_788);
              *pSVar12 = P_ON_UPPER;
            }
            else {
              in_stack_fffffffffffff798 =
                   LPRowSetBase<double>::type
                             ((LPRowSetBase<double> *)
                              CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                              in_stack_fffffffffffff7a4);
              if (in_stack_fffffffffffff798 == EQUAL) {
                pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                    (&local_418,local_788);
                *pSVar12 = P_FIXED;
              }
              else {
                pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                    (&local_418,local_788);
                *pSVar12 = P_ON_LOWER;
              }
            }
          }
          else {
            pcVar14 = MPSInput::field1(&local_780);
            iVar8 = strcmp(pcVar14,"UL");
            if (iVar8 == 0) {
              pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                  (&local_400,iVar9);
              *pSVar12 = P_ON_UPPER;
            }
            else {
              pcVar14 = MPSInput::field1(&local_780);
              iVar8 = strcmp(pcVar14,"LL");
              if (iVar8 != 0) {
                MPSInput::syntaxError
                          ((MPSInput *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790)
                          );
                break;
              }
              pSVar12 = DataArray<soplex::SPxBasisBase<double>::Desc::Status>::operator[]
                                  (&local_400,iVar9);
              *pSVar12 = P_ON_LOWER;
            }
          }
        }
      }
    }
  }
  bVar3 = MPSInput::hasError(&local_780);
  if (!bVar3) {
    SVar10 = MPSInput::section(&local_780);
    if (SVar10 == ENDATA) {
      setStatus((SPxBasisBase<double> *)
                CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                in_stack_fffffffffffff79c);
      (*in_RDI->_vptr_SPxBasisBase[5])(in_RDI,&local_418);
    }
    else {
      MPSInput::syntaxError
                ((MPSInput *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    }
  }
  if (local_18 == (Desc *)0x0) {
    NameSet::~NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    spx_free<soplex::NameSet*>((NameSet **)0x22678f);
  }
  if (local_20 == 0) {
    NameSet::~NameSet((NameSet *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790));
    spx_free<soplex::NameSet*>((NameSet **)0x2267b4);
  }
  bVar3 = MPSInput::hasError(&local_780);
  bVar4 = bVar3 ^ 0xff;
  MPSInput::~MPSInput(&local_780);
  Desc::~Desc((Desc *)CONCAT17(bVar4,in_stack_fffffffffffff790));
  return (bool)(bVar4 & 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}